

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,FunctionCall *c)

{
  size_t *psVar1;
  pool_ref<soul::AST::Expression> *e;
  undefined1 uVar2;
  CommaSeparatedList *pCVar3;
  size_t sVar4;
  pool_ref<soul::AST::Expression> *ppVar5;
  pointer ppVar6;
  VariableDeclaration *this_00;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  Constant *unaff_R15;
  ArrayView<soul::Value> args;
  pool_ptr<soul::AST::Constant> constant;
  Type paramType;
  undefined1 local_200 [64];
  Value local_1c0;
  CompileMessage local_180;
  undefined1 local_148 [8];
  size_t local_140;
  StructurePtr local_138;
  Value local_130 [4];
  
  pCVar3 = (c->super_CallOrCastBase).arguments.object;
  if ((pCVar3 != (CommaSeparatedList *)0x0) && ((pCVar3->items).numActive != 0)) {
    if (pCVar3 == (CommaSeparatedList *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    uVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31;
    sVar4 = (pCVar3->items).numActive;
    if (sVar4 != 0) {
      ppVar5 = (pCVar3->items).items;
      ppVar6 = (c->targetFunction->parameters).
               super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      unaff_R15 = (Constant *)0x0;
      do {
        this_00 = *(VariableDeclaration **)((long)&ppVar6->object + (long)unaff_R15);
        bVar7 = AST::VariableDeclaration::isResolved(this_00);
        if (bVar7) {
          AST::VariableDeclaration::getType((Type *)local_148,this_00);
          e = (pool_ref<soul::AST::Expression> *)((long)&ppVar5->object + (long)unaff_R15);
          (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31 = local_148[2];
          if ((((local_148[2] == true) && (((ulong)local_148 & 0x1000000) == 0)) &&
              (e->object->kind == value)) &&
             ((iVar8 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
              (char)iVar8 != '\0' &&
              (iVar8 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[0xf])(),
              (char)iVar8 == '\0')))) {
            lVar10 = *(long *)((long)&ppVar5->object + (long)unaff_R15);
            CompileMessageHelpers::createMessage<>
                      (&local_180,syntax,error,"Cannot pass a const value as a non-const reference")
            ;
            AST::Context::throwError((Context *)(lVar10 + 0x10),&local_180,false);
          }
          RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
          RefCountedPtr<soul::Structure>::decIfNotNull(local_138.object);
        }
        unaff_R15 = (Constant *)((long)unaff_R15 + 8);
      } while ((Constant *)(sVar4 << 3) != unaff_R15);
    }
    (this->super_ErrorIgnoringRewritingASTVisitor).field_0x31 = uVar2;
    if (c->targetFunction->intrinsic == none) {
      bVar7 = true;
    }
    else {
      local_148 = (undefined1  [8])local_130;
      local_140 = 0;
      local_138.object = (Structure *)0x4;
      pCVar3 = (c->super_CallOrCastBase).arguments.object;
      if ((pCVar3 != (CommaSeparatedList *)0x0) && (sVar4 = (pCVar3->items).numActive, sVar4 != 0))
      {
        ppVar5 = (pCVar3->items).items;
        lVar10 = 0;
        unaff_R15 = (Constant *)local_200;
        do {
          (**(code **)(**(long **)((long)&ppVar5->object + lVar10) + 0x68))(unaff_R15);
          if (CONCAT71(local_200._1_7_,local_200[0]) == 0) break;
          ArrayWithPreallocation<soul::Value,4ul>::emplace_back<soul::Value&>
                    ((ArrayWithPreallocation<soul::Value,4ul> *)local_148,
                     (Value *)(CONCAT71(local_200._1_7_,local_200[0]) + 0x30));
          lVar10 = lVar10 + 8;
        } while (sVar4 << 3 != lVar10);
      }
      pCVar3 = (c->super_CallOrCastBase).arguments.object;
      if (pCVar3 == (CommaSeparatedList *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      if (local_140 == (pCVar3->items).numActive) {
        args.e = (Value *)((long)local_148 + local_140 * 0x40);
        args.s = (Value *)local_148;
        performIntrinsic((Value *)local_200,c->targetFunction->intrinsic,args);
        bVar7 = local_200[0] == invalid;
        if (!bVar7) {
          local_1c0.type.boundingSize = local_200._8_4_;
          local_1c0.type.arrayElementBoundingSize = local_200._12_4_;
          local_1c0.type.structure.object = (Structure *)local_200._16_8_;
          local_1c0.allocatedData.allocatedSize = local_200._24_8_;
          local_200._16_8_ = (Structure *)0x0;
          local_1c0.allocatedData.allocatedData.numAllocated = 8;
          if ((ulong)local_200._48_8_ < 9) {
            local_1c0.allocatedData.allocatedData.items =
                 (uchar *)local_1c0.allocatedData.allocatedData.space;
            if (local_200._40_8_ != 0) {
              uVar9 = 0;
              do {
                *(undefined1 *)((long)local_1c0.allocatedData.allocatedData.items + uVar9) =
                     *(undefined1 *)((long)(_func_int ***)local_200._32_8_ + uVar9);
                uVar9 = uVar9 + 1;
              } while (uVar9 < (ulong)local_200._40_8_);
            }
          }
          else {
            local_1c0.allocatedData.allocatedData.items = (uchar *)local_200._32_8_;
            local_1c0.allocatedData.allocatedData.numAllocated = local_200._48_8_;
            local_200._48_8_ = 8;
            local_200._40_8_ = 0;
            local_200._32_8_ = (Scope *)(local_200 + 0x38);
          }
          unaff_R15 = PoolAllocator::
                      allocate<soul::AST::Constant,soul::AST::Context_const&,soul::Value>
                                (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                                 &(c->super_CallOrCastBase).super_Expression.super_Statement.
                                  super_ASTObject.context,(Value *)(local_200 + 0x40));
          soul::Value::~Value((Value *)(local_200 + 0x40));
        }
        soul::Value::~Value((Value *)local_200);
      }
      else {
        bVar7 = true;
      }
      ArrayWithPreallocation<soul::Value,_4UL>::clear
                ((ArrayWithPreallocation<soul::Value,_4UL> *)local_148);
    }
    if (!bVar7) {
      return &unaff_R15->super_Expression;
    }
  }
  iVar8 = (*(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
            _vptr_ASTObject[3])(c);
  if ((char)iVar8 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  return &((Constant *)c)->super_Expression;
}

Assistant:

AST::Expression& visit (AST::FunctionCall& c) override
        {
            if (c.getNumArguments() != 0)
            {
                auto parameters = c.targetFunction.parameters.begin();
                auto savedIsUsedAsReference = isUsedAsReference;

                for (auto& a : c.arguments->items)
                {
                    auto param = *parameters++;

                    if (param->isResolved())
                    {
                        auto paramType = param->getType();
                        isUsedAsReference = paramType.isReference();

                        if (isUsedAsReference && paramType.isNonConstReference()
                             && AST::isResolvedAsValue (a.get()) && ! a->isAssignable())
                            a->context.throwError (Errors::cannotPassConstAsNonConstRef());

                        replaceExpression (a);
                    }
                }

                isUsedAsReference = savedIsUsedAsReference;

                if (c.targetFunction.isIntrinsic())
                {
                    ArrayWithPreallocation<Value, 4> constantArgs;

                    if (c.arguments != nullptr)
                    {
                        for (auto& arg : c.arguments->items)
                        {
                            if (auto constant = arg->getAsConstant())
                                constantArgs.emplace_back (constant->value);
                            else
                                break;
                        }
                    }

                    if (constantArgs.size() == c.arguments->items.size())
                    {
                        auto result = performIntrinsic (c.targetFunction.intrinsic, constantArgs);

                        if (result.isValid())
                            return createConstant (c.context, std::move (result));
                    }
                }
            }

            failIfNotResolved (c);
            return c;
        }